

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# procs.hpp
# Opt level: O2

MPI_Comm __thiscall henson::ProcMap::intracomm(ProcMap *this,string *to)

{
  _Base_ptr p_Var1;
  iterator iVar2;
  runtime_error *this_00;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  lVar3 = *(long *)(this + 8);
  do {
    if (lVar3 == *(long *)this) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_40,"No intracomm associated with ",to);
      std::runtime_error::runtime_error(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
                    *)(lVar3 + -0x30),to);
    p_Var1 = (_Base_ptr)(lVar3 + -0x28);
    lVar3 = lVar3 + -0x98;
  } while (iVar2._M_node == p_Var1);
  return (MPI_Comm)iVar2._M_node[2]._M_parent;
}

Assistant:

MPI_Comm    intracomm(const std::string& to)
        {
            // Search for the intracomm from the bottom up
            for (auto lit = levels_.rbegin(); lit != levels_.rend(); ++lit)
            {
                IntercommCache::const_iterator it = lit->intercomm_cache.find(to);
                if (it != lit->intercomm_cache.end())
                    return it->second.intra_comm;
            }
            throw std::runtime_error("No intracomm associated with " + to);
        }